

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O0

string * arith_uint256_tests::ArrayToString_abi_cxx11_(uchar *A,uint width)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  uint in_EDX;
  long in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  uint i;
  stringstream Stream;
  int in_stack_fffffffffffffdf8;
  char in_stack_fffffffffffffdfe;
  uint local_1b8;
  stringstream local_190 [16];
  ostream local_180;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_190);
  std::ostream::operator<<(&local_180,std::hex);
  for (local_1b8 = 0; local_1b8 < in_EDX; local_1b8 = local_1b8 + 1) {
    _Var2 = std::setw(in_stack_fffffffffffffdf8);
    poVar3 = std::operator<<(&local_180,_Var2);
    _Var1 = std::setfill<char>(in_stack_fffffffffffffdfe);
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    std::ostream::operator<<(poVar3,(uint)*(byte *)(in_RSI + (ulong)(~local_1b8 + in_EDX)));
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string ArrayToString(const unsigned char A[], unsigned int width)
{
    std::stringstream Stream;
    Stream << std::hex;
    for (unsigned int i = 0; i < width; ++i)
    {
        Stream<<std::setw(2)<<std::setfill('0')<<(unsigned int)A[width-i-1];
    }
    return Stream.str();
}